

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkShareOptimize(Abc_ShaMan_t *p,int fAnd)

{
  int *piVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Aig_t *pMan;
  int *piVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Ptr_t *pVVar6;
  int Entry;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  Vec_Int_t *vInput2;
  Vec_Int_t *vInput;
  
  do {
    Abc_NtkShareFindBestMatch(p->vBuckets,&vInput,&vInput2);
    p_01 = vInput;
    if (vInput == (Vec_Int_t *)0x0) {
      return;
    }
    pAVar2 = p->pNtk;
    iVar4 = Vec_IntEntry(vInput,0);
    pAVar5 = Abc_ObjFromLit(pAVar2,iVar4);
    p_00 = vInput2;
    pAVar2 = p->pNtk;
    iVar4 = Vec_IntEntry(vInput2,0);
    p1 = Abc_ObjFromLit(pAVar2,iVar4);
    pMan = (Abc_Aig_t *)p->pNtk->pManFunc;
    if (fAnd == 0) {
      pAVar5 = Abc_AigXor(pMan,pAVar5,p1);
    }
    else {
      pAVar5 = Abc_AigAnd(pMan,pAVar5,p1);
    }
    p->nCountGates = p->nCountGates + 1;
    p_02 = Vec_IntAlloc(0x10);
    iVar4 = Vec_IntEntry(p_01,0);
    Vec_IntPush(p_02,iVar4);
    iVar4 = Vec_IntEntry(p_01,1);
    Vec_IntPush(p_02,iVar4);
    p_03 = Vec_IntAlloc(0x10);
    iVar4 = Vec_IntEntry(p_00,0);
    Vec_IntPush(p_03,iVar4);
    iVar4 = Vec_IntEntry(p_00,1);
    Vec_IntPush(p_03,iVar4);
    p_04 = Vec_IntAlloc(0x10);
    iVar4 = Abc_ObjToLit(pAVar5);
    Vec_IntPush(p_04,iVar4);
    Vec_IntPush(p_04,*(uint *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x14) >> 0xc);
    p_01->pArray = p_01->pArray + 2;
    piVar3 = p_00->pArray;
    piVar9 = piVar3 + 2;
    p_00->pArray = piVar9;
    p_01->nSize = p_01->nSize + -2;
    iVar4 = p_00->nSize;
    p_00->nSize = iVar4 + -2;
    piVar8 = p_01->pArray;
    piVar1 = piVar8 + p_01->nSize;
    piVar3 = piVar3 + iVar4;
    while ((piVar8 < piVar1 && (piVar9 < piVar3))) {
      iVar4 = *piVar8;
      Entry = *piVar9;
      if (iVar4 == Entry) {
        piVar8 = piVar8 + 1;
        pVVar7 = p_04;
        Entry = iVar4;
LAB_00239317:
        Vec_IntPush(pVVar7,Entry);
        piVar9 = piVar9 + 1;
      }
      else {
        pVVar7 = p_03;
        if (Entry <= iVar4) goto LAB_00239317;
        piVar8 = piVar8 + 1;
        Vec_IntPush(p_02,iVar4);
      }
    }
    for (; piVar8 < piVar1; piVar8 = piVar8 + 1) {
      Vec_IntPush(p_02,*piVar8);
    }
    for (; piVar9 < piVar3; piVar9 = piVar9 + 1) {
      Vec_IntPush(p_03,*piVar9);
    }
    p_01->pArray = p_01->pArray + -2;
    p_00->pArray = p_00->pArray + -2;
    p_01->nSize = p_01->nSize + 2;
    p_00->nSize = p_00->nSize + 2;
    Vec_IntPush(p_02,p->vObj2Lit->nSize);
    Vec_IntPush(p_03,p->vObj2Lit->nSize);
    pVVar7 = p->vObj2Lit;
    iVar4 = Abc_ObjToLit(pAVar5);
    Vec_IntPush(pVVar7,iVar4);
    pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,p_02->nSize + -2);
    Vec_PtrPush(pVVar6,p_02);
    pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,p_03->nSize + -2);
    Vec_PtrPush(pVVar6,p_03);
    pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,p_04->nSize + -2);
    Vec_PtrPush(pVVar6,p_04);
    Vec_IntFree(p_01);
    Vec_IntFree(p_00);
  } while( true );
}

Assistant:

void Abc_NtkShareOptimize( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Obj_t * pObj, * pObj0, * pObj1;
    Vec_Int_t * vInput, * vInput2;
    Vec_Int_t * vNew, * vOld1, * vOld2;
    int i;
    for ( i = 0; ; i++ )
    {
        Abc_NtkShareFindBestMatch( p->vBuckets, &vInput, &vInput2 );
        if ( vInput == NULL )
            break;

        // create new node
        pObj0 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput,  0) );
        pObj1 = Abc_ObjFromLit( p->pNtk, Vec_IntEntry(vInput2, 0) );
        if ( fAnd )
            pObj  = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        else
            pObj  = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pObj0, pObj1 );
        p->nCountGates++;

        // save new node
        vOld1 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  0) );  Vec_IntPush( vOld1, Vec_IntEntry(vInput,  1) );
        vOld2 = Vec_IntAlloc( 16 );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 0) );  Vec_IntPush( vOld2, Vec_IntEntry(vInput2, 1) );
        vNew  = Vec_IntAlloc( 16 );  Vec_IntPush( vNew,  Abc_ObjToLit(pObj) );        Vec_IntPush( vNew, Abc_ObjLevel(Abc_ObjRegular(pObj)) );

        // compute new arrays
        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Vec_IntTwoSplit( vInput, vInput2, vNew, vOld1, vOld2 );

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        // add to the old ones
        Vec_IntPush( vOld1, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( vOld2, Vec_IntSize(p->vObj2Lit) );
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );

        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld1)-SHARE_NUM), vOld1 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vOld2)-SHARE_NUM), vOld2 );
        Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vNew)-SHARE_NUM), vNew );

        Vec_IntFree( vInput );
        Vec_IntFree( vInput2 );
    }
}